

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LowerNewScObjectLiteral(Lowerer *this,Instr *newObjInstr)

{
  LowererMD *this_00;
  Func *func;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  PropertyIndex PVar4;
  uint32 uVar5;
  uint inlineSlotCount;
  uint slotCount;
  IntConstOpnd *pIVar6;
  undefined4 *puVar7;
  JITTimeFunctionBody *pJVar8;
  undefined8 *address;
  PropertyIdArray *propIds;
  intptr_t address_00;
  AddrOpnd *opndArg;
  AddrOpnd *opndArg_00;
  RegOpnd *newObjDst;
  LabelInstr *target;
  MemRefOpnd *src;
  IndirOpnd *src1;
  HelperCallOpnd *src1Opnd;
  Instr *instr;
  Var address_01;
  AddrOpnd *local_48;
  LabelInstr *local_40;
  
  func = this->m_func;
  pIVar6 = (IntConstOpnd *)IR::Instr::UnlinkSrc2(newObjInstr);
  OVar2 = IR::Opnd::GetKind((Opnd *)pIVar6);
  if (OVar2 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar3) goto LAB_005a6a9c;
    *puVar7 = 0;
  }
  pJVar8 = JITTimeWorkItem::GetJITFunctionBody(newObjInstr->m_func->m_workItem);
  uVar5 = IR::IntConstOpnd::AsUint32(pIVar6);
  address = (undefined8 *)JITTimeFunctionBody::GetObjectLiteralTypeRef(pJVar8,uVar5);
  pIVar6 = (IntConstOpnd *)IR::Instr::UnlinkSrc1(newObjInstr);
  OVar2 = IR::Opnd::GetKind((Opnd *)pIVar6);
  if (OVar2 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar3) goto LAB_005a6a9c;
    *puVar7 = 0;
  }
  pJVar8 = JITTimeWorkItem::GetJITFunctionBody(newObjInstr->m_func->m_workItem);
  uVar5 = IR::IntConstOpnd::AsUint32(pIVar6);
  propIds = JITTimeFunctionBody::ReadPropertyIdArrayFromAuxData(pJVar8,uVar5);
  pJVar8 = JITTimeWorkItem::GetJITFunctionBody(newObjInstr->m_func->m_workItem);
  uVar5 = IR::IntConstOpnd::AsUint32(pIVar6);
  address_00 = JITTimeFunctionBody::GetAuxDataAddr(pJVar8,uVar5);
  inlineSlotCount = Js::JavascriptOperators::GetLiteralInlineSlotCapacity(propIds);
  slotCount = Js::JavascriptOperators::GetLiteralSlotCapacity(propIds);
  address_01 = (Var)0x0;
  opndArg = IR::AddrOpnd::New((intptr_t)address,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0)
  ;
  opndArg_00 = IR::AddrOpnd::New(address_00,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
  if (DAT_015bbe7e == '\x01') {
    address_01 = (Var)*address;
  }
  if ((address_01 == (Var)0x0) || (*(char *)((long)address_01 + 0x31) == '\0')) {
    target = IR::LabelInstr::New(Label,func,true);
    local_40 = IR::LabelInstr::New(Label,func,false);
    local_48 = (AddrOpnd *)IR::RegOpnd::New(TyUint64,func);
    src = IR::MemRefOpnd::New((intptr_t)address,TyUint64,func,AddrOpndKindDynamicMisc);
    InsertMove((Opnd *)local_48,&src->super_Opnd,newObjInstr,true);
    InsertTest((Opnd *)local_48,(Opnd *)local_48,newObjInstr);
    InsertBranch(BrEq_A,false,target,newObjInstr);
    OVar2 = IR::Opnd::GetKind((Opnd *)local_48);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_005a6a9c;
      *puVar7 = 0;
    }
    src1 = IR::IndirOpnd::New((RegOpnd *)local_48,0x31,TyInt8,func,false);
    pIVar6 = IR::IntConstOpnd::New(1,TyInt8,func,true);
    InsertTest(&src1->super_Opnd,&pIVar6->super_Opnd,newObjInstr);
    InsertBranch(BrEq_A,false,target,newObjInstr);
    newObjDst = (RegOpnd *)newObjInstr->m_dst;
    OVar2 = IR::Opnd::GetKind((Opnd *)newObjDst);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_005a6a9c;
      goto LAB_005a6871;
    }
  }
  else {
    local_48 = IR::AddrOpnd::New(address_01,AddrOpndKindDynamicType,func,false,(Var)0x0);
    newObjDst = (RegOpnd *)IR::Instr::UnlinkDst(newObjInstr);
    OVar2 = IR::Opnd::GetKind((Opnd *)newObjDst);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_005a6a9c;
      *puVar7 = 0;
    }
    if (inlineSlotCount != *(ushort *)(*(long *)((long)address_01 + 0x28) + 0x12)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xde3,
                         "(inlineSlotCapacity == literalType->GetTypeHandler()->GetInlineSlotCapacity())"
                         ,
                         "inlineSlotCapacity == literalType->GetTypeHandler()->GetInlineSlotCapacity()"
                        );
      if (!bVar3) goto LAB_005a6a9c;
      *puVar7 = 0;
    }
    if (slotCount == *(uint *)(*(long *)((long)address_01 + 0x28) + 0xc)) {
      local_40 = (LabelInstr *)0x0;
      target = (LabelInstr *)0x0;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xde4,
                         "(slotCapacity == (uint)literalType->GetTypeHandler()->GetSlotCapacity())",
                         "slotCapacity == (uint)literalType->GetTypeHandler()->GetSlotCapacity()");
      if (!bVar3) goto LAB_005a6a9c;
      local_40 = (LabelInstr *)0x0;
      target = (LabelInstr *)0x0;
LAB_005a6871:
      *puVar7 = 0;
    }
  }
  if (target == (LabelInstr *)0x0) {
    if (local_40 != (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xdfb,"(allocLabel == nullptr)","allocLabel == nullptr");
      if (!bVar3) goto LAB_005a6a9c;
      *puVar7 = 0;
    }
  }
  else {
    InsertBranch(Br,false,local_40,newObjInstr);
    IR::Instr::InsertBefore(newObjInstr,&target->super_Instr);
    src1Opnd = IR::HelperCallOpnd::New(HelperEnsureObjectLiteralType,func);
    this_00 = &this->m_lowererMD;
    LowererMD::LoadHelperArgument(this_00,newObjInstr,&opndArg->super_Opnd);
    LowererMD::LoadHelperArgument(this_00,newObjInstr,&opndArg_00->super_Opnd);
    LoadScriptContext(this,newObjInstr);
    instr = IR::Instr::New(Call,&local_48->super_Opnd,&src1Opnd->super_Opnd,func);
    IR::Instr::InsertBefore(newObjInstr,instr);
    LowererMD::LowerCall(this_00,instr,0);
    IR::Instr::InsertBefore(newObjInstr,&local_40->super_Instr);
  }
  bVar3 = Js::FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds);
  if (bVar3) {
    PVar4 = Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    if (inlineSlotCount < PVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xe03,
                         "(inlineSlotCapacity >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity())"
                         ,
                         "inlineSlotCapacity >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()"
                        );
      if (!bVar3) goto LAB_005a6a9c;
      *puVar7 = 0;
    }
    if (inlineSlotCount != slotCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xe04,"(inlineSlotCapacity == slotCapacity)",
                         "inlineSlotCapacity == slotCapacity");
      if (!bVar3) {
LAB_005a6a9c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    PVar4 = Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    inlineSlotCount = inlineSlotCount - PVar4;
    slotCount = inlineSlotCount;
  }
  GenerateDynamicObjectAlloc
            (this,newObjInstr,inlineSlotCount,slotCount,newObjDst,&local_48->super_Opnd);
  IR::Instr::Remove(newObjInstr);
  return;
}

Assistant:

void
Lowerer::LowerNewScObjectLiteral(IR::Instr *newObjInstr)
{
    Func * func = m_func;
    IR::IntConstOpnd * literalObjectIdOpnd = newObjInstr->UnlinkSrc2()->AsIntConstOpnd();
    intptr_t literalTypeRef = newObjInstr->m_func->GetJITFunctionBody()->GetObjectLiteralTypeRef(literalObjectIdOpnd->AsUint32());

    IR::LabelInstr * helperLabel = nullptr;
    IR::LabelInstr * allocLabel = nullptr;
    IR::Opnd * literalTypeRefOpnd;
    IR::Opnd * literalTypeOpnd;
    IR::Opnd * propertyArrayOpnd;

    IR::IntConstOpnd * propertyArrayIdOpnd = newObjInstr->UnlinkSrc1()->AsIntConstOpnd();
    const Js::PropertyIdArray * propIds = newObjInstr->m_func->GetJITFunctionBody()->ReadPropertyIdArrayFromAuxData(propertyArrayIdOpnd->AsUint32());
    intptr_t propArrayAddr = newObjInstr->m_func->GetJITFunctionBody()->GetAuxDataAddr(propertyArrayIdOpnd->AsUint32());
    uint inlineSlotCapacity = Js::JavascriptOperators::GetLiteralInlineSlotCapacity(propIds);
    uint slotCapacity = Js::JavascriptOperators::GetLiteralSlotCapacity(propIds);
    IR::RegOpnd * dstOpnd;

    literalTypeRefOpnd = IR::AddrOpnd::New(literalTypeRef, IR::AddrOpndKindDynamicMisc, this->m_func);
    propertyArrayOpnd = IR::AddrOpnd::New(propArrayAddr, IR::AddrOpndKindDynamicMisc, this->m_func);

    //#if 0 TODO: OOP JIT, obj literal types
    // should pass in isShared bit through RPC, enable for in-proc jit to see perf impact
    Js::DynamicType * literalType = func->IsOOPJIT() || !CONFIG_FLAG(OOPJITMissingOpts) ? nullptr : *(Js::DynamicType **)literalTypeRef;

    if (literalType == nullptr || !literalType->GetIsShared())
    {
        helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        allocLabel = IR::LabelInstr::New(Js::OpCode::Label, func);

        literalTypeOpnd = IR::RegOpnd::New(TyMachPtr, func);
        InsertMove(literalTypeOpnd, IR::MemRefOpnd::New(literalTypeRef, TyMachPtr, func), newObjInstr);
        InsertTestBranch(literalTypeOpnd, literalTypeOpnd,
            Js::OpCode::BrEq_A, helperLabel, newObjInstr);
        InsertTestBranch(IR::IndirOpnd::New(literalTypeOpnd->AsRegOpnd(), Js::DynamicType::GetOffsetOfIsShared(), TyInt8, func),
            IR::IntConstOpnd::New(1, TyInt8, func, true), Js::OpCode::BrEq_A, helperLabel, newObjInstr);

        dstOpnd = newObjInstr->GetDst()->AsRegOpnd();
    }
    else
    {
        literalTypeOpnd = IR::AddrOpnd::New(literalType, IR::AddrOpndKindDynamicType, func);
        dstOpnd = newObjInstr->UnlinkDst()->AsRegOpnd();
        Assert(inlineSlotCapacity == literalType->GetTypeHandler()->GetInlineSlotCapacity());
        Assert(slotCapacity == (uint)literalType->GetTypeHandler()->GetSlotCapacity());
    }

    if (helperLabel)
    {
        InsertBranch(Js::OpCode::Br, allocLabel, newObjInstr);

        // Slow path to ensure the type is there
        newObjInstr->InsertBefore(helperLabel);
        IR::HelperCallOpnd * opndHelper = IR::HelperCallOpnd::New(IR::HelperEnsureObjectLiteralType, func);

        m_lowererMD.LoadHelperArgument(newObjInstr, literalTypeRefOpnd);
        m_lowererMD.LoadHelperArgument(newObjInstr, propertyArrayOpnd);
        LoadScriptContext(newObjInstr);

        IR::Instr * ensureTypeInstr = IR::Instr::New(Js::OpCode::Call, literalTypeOpnd, opndHelper, func);
        newObjInstr->InsertBefore(ensureTypeInstr);
        m_lowererMD.LowerCall(ensureTypeInstr, 0);

        newObjInstr->InsertBefore(allocLabel);
    }
    else
    {
        Assert(allocLabel == nullptr);
    }

    // For the next call:
    //     inlineSlotCapacity == Number of slots to allocate beyond the DynamicObject header
    //     slotCapacity - inlineSlotCapacity == Number of aux slots to allocate
    if(Js::FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds))
    {
        Assert(inlineSlotCapacity >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity());
        Assert(inlineSlotCapacity == slotCapacity);
        slotCapacity = inlineSlotCapacity -= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    }
    GenerateDynamicObjectAlloc(
        newObjInstr,
        inlineSlotCapacity,
        slotCapacity,
        dstOpnd,
        literalTypeOpnd);

    newObjInstr->Remove();
}